

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

int Acb_NtkFindSupp1(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *end;
  int *pFanins;
  int iFanin;
  int k;
  int status;
  int nSuppNew;
  Vec_Int_t *vWin_local;
  int nDivs_local;
  int nVars_local;
  sat_solver *pSat_local;
  int Pivot_local;
  Acb_Ntk_t *p_local;
  
  Vec_IntClear(vSupp);
  pFanins._4_4_ = 0;
  piVar3 = Acb_ObjFanins(p,Pivot);
  for (; pFanins._4_4_ < *piVar3; pFanins._4_4_ = pFanins._4_4_ + 1) {
    Vec_IntPush(vSupp,piVar3[pFanins._4_4_ + 1]);
  }
  Acb_NtkOrderByRefCount(p,vSupp);
  Acb_NtkRemapIntoSatVariables(p,vSupp);
  Vec_IntVars2Lits(vSupp,nVars << 1,0);
  piVar3 = Vec_IntArray(vSupp);
  end = Vec_IntLimit(vSupp);
  iVar1 = sat_solver_solve(pSat,piVar3,end,0,0,0,0);
  if (iVar1 == -1) {
    piVar3 = Vec_IntArray(vSupp);
    iVar1 = Vec_IntSize(vSupp);
    iVar1 = sat_solver_minimize_assumptions(pSat,piVar3,iVar1,0);
    Vec_IntShrink(vSupp,iVar1);
    Vec_IntLits2Vars(vSupp,nVars * -2);
    iVar1 = Vec_IntSize(vSupp);
    iVar2 = Acb_ObjFaninNum(p,Pivot);
    return (int)(iVar1 < iVar2);
  }
  printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
  __assert_fail("status == l_False",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                ,0x39e,
                "int Acb_NtkFindSupp1(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

int Acb_NtkFindSupp1( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp )
{
    int nSuppNew, status, k, iFanin, * pFanins;
    Vec_IntClear( vSupp );
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        Vec_IntPush( vSupp, iFanin );
    Acb_NtkOrderByRefCount( p, vSupp );
    Acb_NtkRemapIntoSatVariables( p, vSupp );
    Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
    status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
    if ( status != l_False )
        printf( "Failed internal check at node %d.\n", Pivot );
    assert( status == l_False );
    nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
    Vec_IntShrink( vSupp, nSuppNew );
    Vec_IntLits2Vars( vSupp, -2*nVars );
    return Vec_IntSize(vSupp) < Acb_ObjFaninNum(p, Pivot);
}